

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streaminfo.c
# Opt level: O2

void mpt_stream_setnewline(mpt_streaminfo *info,int nl,int what)

{
  bool bVar1;
  ulong uVar2;
  
  if ((what & 3U) == 0) {
    bVar1 = true;
LAB_0010869f:
    uVar2 = info->_fd & 0xffffffffffffcfff | (ulong)((nl & 3U) << 0xc);
    if (bVar1) goto LAB_001086c4;
  }
  else {
    if ((what & 3U) != 1) {
      bVar1 = false;
      goto LAB_0010869f;
    }
    uVar2 = info->_fd;
  }
  uVar2 = uVar2 & 0xffffffffffff3fff | (ulong)((nl & 3U) << 0xe);
LAB_001086c4:
  info->_fd = uVar2;
  return;
}

Assistant:

extern void mpt_stream_setnewline(MPT_STRUCT(streaminfo) *info, int nl, int what)
{
	switch (what & 0x3) {
	  case MPT_STREAMFLAG(Read):  what = 0x1; break;
	  case MPT_STREAMFLAG(Write): what = 0x2; break;
	  default:                    what = 0x3;
	}
	nl &= 0x3;
	if (what & 0x1) {
		info->_fd = (nl << 12) | (info->_fd & ~(0x3 << 12));
	}
	if (what & 0x2) {
		info->_fd = (nl << 14) | (info->_fd & ~(0x3 << 14));
	}
}